

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

error builtin_multiply(vector *vargs,atom *result)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  double dVar4;
  
  sVar1 = vargs->size;
  dVar4 = 1.0;
  lVar2 = 8;
  while( true ) {
    bVar3 = sVar1 == 0;
    sVar1 = sVar1 - 1;
    if (bVar3) {
      result->type = T_NUM;
      (result->value).number = dVar4;
      return ERROR_OK;
    }
    if (*(int *)((long)vargs->data + lVar2 + -8) != 3) break;
    dVar4 = dVar4 * *(double *)((long)&vargs->data->type + lVar2);
    lVar2 = lVar2 + 0x10;
  }
  return ERROR_TYPE;
}

Assistant:

error builtin_multiply(struct vector *vargs, atom *result)
{
	double r = 1;
	size_t i;
	for (i = 0; i < vargs->size; i++) {
		if (vargs->data[i].type != T_NUM) return ERROR_TYPE;
		r *= vargs->data[i].value.number;
	}
	*result = make_number(r);
	return ERROR_OK;
}